

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void toggle_overlays(Fl_Widget *param_1,void *param_2)

{
  int iVar1;
  Fl_Widget_Type *w;
  Fl_Type *o;
  void *param_1_local;
  Fl_Widget *param_0_local;
  
  overlays_invisible = (int)((overlays_invisible != 0 ^ 0xffU) & 1);
  if (overlays_invisible == 0) {
    Fl_Menu_Item::label(Main_Menu + 0x28,"Hide O&verlays");
  }
  else {
    Fl_Menu_Item::label(Main_Menu + 0x28,"Show O&verlays");
  }
  for (w = (Fl_Widget_Type *)Fl_Type::first; w != (Fl_Widget_Type *)0x0;
      w = (Fl_Widget_Type *)(w->super_Fl_Type).next) {
    iVar1 = (*(w->super_Fl_Type)._vptr_Fl_Type[0x21])();
    if (iVar1 != 0) {
      Fl_Overlay_Window::redraw_overlay((Fl_Overlay_Window *)w->o);
    }
  }
  return;
}

Assistant:

void toggle_overlays(Fl_Widget *,void *) {
  overlays_invisible = !overlays_invisible;

  if (overlays_invisible) Main_Menu[40].label("Show O&verlays");
  else Main_Menu[40].label("Hide O&verlays");

  for (Fl_Type *o=Fl_Type::first; o; o=o->next)
    if (o->is_window()) {
      Fl_Widget_Type* w = (Fl_Widget_Type*)o;
      ((Overlay_Window*)(w->o))->redraw_overlay();
    }
}